

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.cpp
# Opt level: O0

void * allocMemoryPages(size_t bytes)

{
  void *pvVar1;
  runtime_error *this;
  size_t in_RDI;
  void *mem;
  
  pvVar1 = mmap((void *)0x0,in_RDI,3,0x22,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"allocMemoryPages - mmap failed");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return pvVar1;
}

Assistant:

void* allocMemoryPages(std::size_t bytes) {
	void* mem;
#if defined(_WIN32) || defined(__CYGWIN__)
	mem = VirtualAlloc(nullptr, bytes, MEM_COMMIT, PAGE_READWRITE);
	if (mem == nullptr)
		throw std::runtime_error(getErrorMessage("allocMemoryPages - VirtualAlloc"));
#else
	#if defined(__NetBSD__)
		#define RESERVED_FLAGS PROT_MPROTECT(PROT_EXEC)
	#else
		#define RESERVED_FLAGS 0
	#endif
	mem = mmap(nullptr, bytes, PAGE_READWRITE | RESERVED_FLAGS, MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
	if (mem == MAP_FAILED)
		throw std::runtime_error("allocMemoryPages - mmap failed");
#endif
	return mem;
}